

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O0

void __thiscall clara::TextFlow::Spacer::Spacer(Spacer *this,size_t spaceWidth)

{
  allocator<char> local_39;
  string local_38;
  size_t local_18;
  size_t spaceWidth_local;
  Spacer *this_local;
  
  local_18 = spaceWidth;
  spaceWidth_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  Column::Column(&this->super_Column,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  Column::width(&this->super_Column,local_18);
  return;
}

Assistant:

explicit Spacer( size_t spaceWidth ) : Column( "" ) {
            width( spaceWidth );
        }